

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

pair<const_void_*,_int> __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FindExtension
          (DescriptorIndex *this,StringPiece containing_type,int field_number)

{
  StringPiece y;
  bool bVar1;
  pointer pEVar2;
  reference this_00;
  Value VVar3;
  pair<const_void_*,_int> pVar4;
  int local_b0 [2];
  pair<std::nullptr_t,_int> local_a8;
  DescriptorIndex *local_98;
  char *local_90;
  StringPiece local_88;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
  local_78;
  DescriptorIndex *local_70;
  tuple<google::protobuf::stringpiece_internal::StringPiece,_int> local_68;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
  local_50;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
  local_48;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
  local_40;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
  it;
  int field_number_local;
  DescriptorIndex *this_local;
  StringPiece containing_type_local;
  int local_10;
  
  containing_type_local.ptr_ = (char *)containing_type.length_;
  this_local = (DescriptorIndex *)containing_type.ptr_;
  it._M_current._4_4_ = field_number;
  EnsureFlat(this);
  local_48._M_current =
       (ExtensionEntry *)
       std::
       vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
       ::begin(&this->by_extension_flat_);
  local_50._M_current =
       (ExtensionEntry *)
       std::
       vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
       ::end(&this->by_extension_flat_);
  std::make_tuple<google::protobuf::stringpiece_internal::StringPiece&,int&>
            (&local_68,(StringPiece *)&this_local,(int *)((long)&it._M_current + 4));
  local_70 = (DescriptorIndex *)
             std::
             set<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
             ::key_comp(&this->by_extension_);
  local_40 = std::
             lower_bound<__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>>>,std::tuple<google::protobuf::stringpiece_internal::StringPiece,int>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare>
                       (local_48,local_50,&local_68,(ExtensionCompare)local_70);
  local_78._M_current =
       (ExtensionEntry *)
       std::
       vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
       ::end(&this->by_extension_flat_);
  bVar1 = __gnu_cxx::operator==(&local_40,&local_78);
  if (!bVar1) {
    pEVar2 = __gnu_cxx::
             __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
             ::operator->(&local_40);
    local_88 = ExtensionEntry::extendee(pEVar2,this);
    local_98 = this_local;
    local_90 = containing_type_local.ptr_;
    y.length_ = (size_type)containing_type_local.ptr_;
    y.ptr_ = (char *)this_local;
    bVar1 = stringpiece_internal::operator!=(local_88,y);
    if (!bVar1) {
      pEVar2 = __gnu_cxx::
               __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
               ::operator->(&local_40);
      if (pEVar2->extension_number == it._M_current._4_4_) {
        pEVar2 = __gnu_cxx::
                 __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
                 ::operator->(&local_40);
        this_00 = std::
                  vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                  ::operator[](&this->all_values_,(long)pEVar2->data_offset);
        VVar3 = EncodedEntry::value(this_00);
        containing_type_local.length_ = (size_type)VVar3.first;
        local_10 = VVar3.second;
        goto LAB_006c09e9;
      }
    }
  }
  local_b0[0] = 0;
  local_b0[1] = 0;
  std::make_pair<decltype(nullptr),int>(&local_a8.first,local_b0);
  std::pair<const_void_*,_int>::pair<std::nullptr_t,_int,_true>
            ((pair<const_void_*,_int> *)&containing_type_local.length_,&local_a8);
LAB_006c09e9:
  pVar4.second = local_10;
  pVar4.first = (void *)containing_type_local.length_;
  pVar4._12_4_ = 0;
  return pVar4;
}

Assistant:

std::pair<const void*, int>
EncodedDescriptorDatabase::DescriptorIndex::FindExtension(
    StringPiece containing_type, int field_number) {
  EnsureFlat();

  auto it = std::lower_bound(
      by_extension_flat_.begin(), by_extension_flat_.end(),
      std::make_tuple(containing_type, field_number), by_extension_.key_comp());
  return it == by_extension_flat_.end() ||
                 it->extendee(*this) != containing_type ||
                 it->extension_number != field_number
             ? std::make_pair(nullptr, 0)
             : all_values_[it->data_offset].value();
}